

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * chck_cstr_replace_char(char *cstr,char replace,char with)

{
  char *local_28;
  char *s;
  char with_local;
  char replace_local;
  char *cstr_local;
  
  if ((cstr != (char *)0x0) && (replace != with)) {
    local_28 = cstr;
    if (replace != with) {
      while (local_28 = strchr(local_28,(int)replace), local_28 != (char *)0x0) {
        *local_28 = with;
      }
    }
    return cstr;
  }
  __assert_fail("cstr && replace != with",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/string/string.c"
                ,0x8d,"char *chck_cstr_replace_char(char *, char, char)");
}

Assistant:

char*
chck_cstr_replace_char(char *cstr, char replace, char with)
{
   assert(cstr && replace != with);

   if (replace == with)
      return cstr;

   char *s = cstr;
   while ((s = strchr(s, replace)))
      *s = with;
   return cstr;
}